

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

BUFFER_HANDLE
mqtt_codec_publish(QOS_VALUE qosValue,_Bool duplicateMsg,_Bool serverRetain,uint16_t packetId,
                  char *topicName,uint8_t *msgBuffer,size_t buffLen,STRING_HANDLE trace_log)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  uchar *puVar5;
  uint8_t *iterator;
  size_t payloadOffset;
  STRING_HANDLE varible_header_log;
  undefined1 auStack_48 [7];
  uint8_t headerFlags;
  PUBLISH_HEADER_INFO publishInfo;
  BUFFER_HANDLE result;
  uint8_t *msgBuffer_local;
  char *topicName_local;
  uint16_t packetId_local;
  _Bool serverRetain_local;
  _Bool duplicateMsg_local;
  QOS_VALUE qosValue_local;
  
  if (topicName == (char *)0x0) {
    publishInfo.qualityOfServiceValue = DELIVER_AT_MOST_ONCE;
    publishInfo._28_4_ = 0;
  }
  else if (buffLen < 0xffffff80) {
    memset(auStack_48,0,0x20);
    varible_header_log._7_1_ = 0;
    if (duplicateMsg) {
      varible_header_log._7_1_ = 8;
    }
    if (serverRetain) {
      varible_header_log._7_1_ = varible_header_log._7_1_ | 1;
    }
    if (qosValue != DELIVER_AT_MOST_ONCE) {
      if (qosValue == DELIVER_AT_LEAST_ONCE) {
        varible_header_log._7_1_ = varible_header_log._7_1_ | 2;
      }
      else {
        varible_header_log._7_1_ = varible_header_log._7_1_ | 4;
      }
    }
    _auStack_48 = topicName;
    publishInfo.topicName._0_2_ = packetId;
    publishInfo.msgBuffer._0_4_ = qosValue;
    publishInfo._24_8_ = BUFFER_new();
    if ((BUFFER_HANDLE)publishInfo._24_8_ != (BUFFER_HANDLE)0x0) {
      payloadOffset = 0;
      if (trace_log != (STRING_HANDLE)0x0) {
        pcVar2 = "false";
        if (duplicateMsg) {
          pcVar2 = "true";
        }
        pcVar3 = retrieve_qos_value((QOS_VALUE)publishInfo.msgBuffer);
        payloadOffset =
             (size_t)STRING_construct_sprintf
                               (" | IS_DUP: %s | RETAIN: %d | QOS: %s",pcVar2,(ulong)serverRetain,
                                pcVar3);
      }
      iVar1 = constructPublishVariableHeader
                        ((BUFFER_HANDLE)publishInfo._24_8_,(PUBLISH_HEADER_INFO *)auStack_48,
                         (STRING_HANDLE)payloadOffset);
      if (iVar1 == 0) {
        sVar4 = BUFFER_length((BUFFER_HANDLE)publishInfo._24_8_);
        if (buffLen != 0) {
          iVar1 = BUFFER_enlarge((BUFFER_HANDLE)publishInfo._24_8_,buffLen);
          if (iVar1 == 0) {
            puVar5 = BUFFER_u_char((BUFFER_HANDLE)publishInfo._24_8_);
            if (puVar5 == (uchar *)0x0) {
              BUFFER_delete((BUFFER_HANDLE)publishInfo._24_8_);
              publishInfo.qualityOfServiceValue = DELIVER_AT_MOST_ONCE;
              publishInfo._28_4_ = 0;
            }
            else {
              memcpy(puVar5 + sVar4,msgBuffer,buffLen);
              if (trace_log != (STRING_HANDLE)0x0) {
                STRING_sprintf((STRING_HANDLE)payloadOffset," | PAYLOAD_LEN: %lu",buffLen);
              }
            }
          }
          else {
            BUFFER_delete((BUFFER_HANDLE)publishInfo._24_8_);
            publishInfo.qualityOfServiceValue = DELIVER_AT_MOST_ONCE;
            publishInfo._28_4_ = 0;
          }
        }
        if (publishInfo._24_8_ != 0) {
          if (trace_log != (STRING_HANDLE)0x0) {
            STRING_copy(trace_log,"PUBLISH");
          }
          iVar1 = constructFixedHeader
                            ((BUFFER_HANDLE)publishInfo._24_8_,PUBLISH_TYPE,varible_header_log._7_1_
                            );
          if (iVar1 == 0) {
            if (trace_log != (STRING_HANDLE)0x0) {
              STRING_concat_with_STRING(trace_log,(STRING_HANDLE)payloadOffset);
            }
          }
          else {
            BUFFER_delete((BUFFER_HANDLE)publishInfo._24_8_);
            publishInfo.qualityOfServiceValue = DELIVER_AT_MOST_ONCE;
            publishInfo._28_4_ = 0;
          }
        }
      }
      else {
        BUFFER_delete((BUFFER_HANDLE)publishInfo._24_8_);
        publishInfo.qualityOfServiceValue = DELIVER_AT_MOST_ONCE;
        publishInfo._28_4_ = 0;
      }
      if (payloadOffset != 0) {
        STRING_delete((STRING_HANDLE)payloadOffset);
      }
    }
  }
  else {
    publishInfo.qualityOfServiceValue = DELIVER_AT_MOST_ONCE;
    publishInfo._28_4_ = 0;
  }
  return (BUFFER_HANDLE)publishInfo._24_8_;
}

Assistant:

BUFFER_HANDLE mqtt_codec_publish(QOS_VALUE qosValue, bool duplicateMsg, bool serverRetain, uint16_t packetId, const char* topicName, const uint8_t* msgBuffer, size_t buffLen, STRING_HANDLE trace_log)
{
    BUFFER_HANDLE result;
    /* Codes_SRS_MQTT_CODEC_07_005: [If the parameters topicName is NULL then mqtt_codec_publish shall return NULL.] */
    if (topicName == NULL)
    {
        result = NULL;
    }
    /* Codes_SRS_MQTT_CODEC_07_036: [mqtt_codec_publish shall return NULL if the buffLen variable is greater than the MAX_SEND_SIZE (0xFFFFFF7F).] */
    else if (buffLen > MAX_SEND_SIZE)
    {
        /* Codes_SRS_MQTT_CODEC_07_006: [If any error is encountered then mqtt_codec_publish shall return NULL.] */
        result = NULL;
    }
    else
    {
        PUBLISH_HEADER_INFO publishInfo ={ 0 };
        publishInfo.topicName = topicName;
        publishInfo.packetId = packetId;
        publishInfo.qualityOfServiceValue = qosValue;

        uint8_t headerFlags = 0;
        if (duplicateMsg) headerFlags |= PUBLISH_DUP_FLAG;
        if (serverRetain) headerFlags |= PUBLISH_QOS_RETAIN;
        if (qosValue != DELIVER_AT_MOST_ONCE)
        {
            if (qosValue == DELIVER_AT_LEAST_ONCE)
            {
                headerFlags |= PUBLISH_QOS_AT_LEAST_ONCE;
            }
            else
            {
                headerFlags |= PUBLISH_QOS_EXACTLY_ONCE;
            }
        }

        /* Codes_SRS_MQTT_CODEC_07_007: [mqtt_codec_publish shall return a BUFFER_HANDLE that represents a MQTT PUBLISH message.] */
        result = BUFFER_new();
        if (result != NULL)
        {
            STRING_HANDLE varible_header_log = NULL;
            if (trace_log != NULL)
            {
                varible_header_log = STRING_construct_sprintf(" | IS_DUP: %s | RETAIN: %d | QOS: %s", duplicateMsg ? TRUE_CONST : FALSE_CONST,
                    serverRetain ? 1 : 0,
                    retrieve_qos_value(publishInfo.qualityOfServiceValue) );
            }

            if (constructPublishVariableHeader(result, &publishInfo, varible_header_log) != 0)
            {
                /* Codes_SRS_MQTT_CODEC_07_006: [If any error is encountered then mqtt_codec_publish shall return NULL.] */
                BUFFER_delete(result);
                result = NULL;
            }
            else
            {
                size_t payloadOffset = BUFFER_length(result);
                if (buffLen > 0)
                {
                    if (BUFFER_enlarge(result, buffLen) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_006: [If any error is encountered then mqtt_codec_publish shall return NULL.] */
                        BUFFER_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        uint8_t* iterator = BUFFER_u_char(result);
                        if (iterator == NULL)
                        {
                            /* Codes_SRS_MQTT_CODEC_07_006: [If any error is encountered then mqtt_codec_publish shall return NULL.] */
                            BUFFER_delete(result);
                            result = NULL;
                        }
                        else
                        {
                            iterator += payloadOffset;
                            // Write Message
                            (void)memcpy(iterator, msgBuffer, buffLen);
                            if (trace_log)
                            {
                                STRING_sprintf(varible_header_log, " | PAYLOAD_LEN: %lu", (unsigned long)buffLen);
                            }
                        }
                    }
                }

                if (result != NULL)
                {
                    if (trace_log != NULL)
                    {
                        (void)STRING_copy(trace_log, "PUBLISH");
                    }
                    if (constructFixedHeader(result, PUBLISH_TYPE, headerFlags) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_006: [If any error is encountered then mqtt_codec_publish shall return NULL.] */
                        BUFFER_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        if (trace_log != NULL)
                        {
                            (void)STRING_concat_with_STRING(trace_log, varible_header_log);
                        }
                    }
                }
            }
            if (varible_header_log != NULL)
            {
                STRING_delete(varible_header_log);
            }
        }
    }
    return result;
}